

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O3

FT_Error T1_Set_Var_Design(T1_Face face,FT_UInt num_coords,FT_Fixed *coords)

{
  FT_Error FVar1;
  FT_Fixed FVar2;
  ulong uVar3;
  uint num_coords_00;
  FT_Long local_58;
  FT_Long lcoords [4];
  
  num_coords_00 = 4;
  if (num_coords < 4) {
    num_coords_00 = num_coords;
  }
  if (num_coords != 0) {
    uVar3 = 0;
    do {
      FVar2 = FT_RoundFix(coords[uVar3]);
      lcoords[uVar3 - 1] = FVar2 >> 0x10;
      uVar3 = uVar3 + 1;
    } while (num_coords_00 != uVar3);
  }
  FVar1 = T1_Set_MM_Design(face,num_coords_00,&local_58);
  return FVar1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Set_Var_Design( T1_Face    face,
                     FT_UInt    num_coords,
                     FT_Fixed*  coords )
  {
     FT_Long  lcoords[T1_MAX_MM_AXIS];
     FT_UInt  i;


     if ( num_coords > T1_MAX_MM_AXIS )
       num_coords = T1_MAX_MM_AXIS;

     for ( i = 0; i < num_coords; i++ )
       lcoords[i] = FIXED_TO_INT( coords[i] );

     return T1_Set_MM_Design( face, num_coords, lcoords );
  }